

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MappingTypes.hpp
# Opt level: O0

ostream * operator<<(ostream *os,LongReadMapping *m)

{
  ostream *poVar1;
  long *in_RSI;
  ostream *in_RDI;
  
  poVar1 = std::operator<<(in_RDI,"LongReadMapping ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(uint *)(in_RSI + 1));
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)in_RSI + 0x14));
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)in_RSI[3]);
  poVar1 = std::operator<<(poVar1,") -> ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*in_RSI);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)in_RSI + 0xc));
  poVar1 = std::operator<<(poVar1,":");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)in_RSI[2]);
  poVar1 = std::operator<<(poVar1,")  ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)((long)in_RSI + 0x1c));
  std::operator<<(poVar1," hits");
  return in_RDI;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const LongReadMapping& m){
        os << "LongReadMapping " << m.read_id << " (" << m.qStart << ":" << m.qEnd << ") -> "
                                  << m.node << " (" << m.nStart << ":" << m.nEnd << ")  " <<m.score<< " hits";
        return os;
    }